

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall
pfederc::Lexer::Lexer(Lexer *this,LanguageConfiguration *cfg,istream *input,string *filePath)

{
  allocator<char> local_11;
  
  this->_vptr_Lexer = (_func_int **)&PTR__Lexer_0010fcc8;
  this->cfg = *cfg;
  this->input = input;
  std::__cxx11::string::string((string *)&this->filePath,(string *)filePath);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->fileContent,"",&local_11);
  (this->errors).
  super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->currentStartIndex = 0;
  (this->errors).
  super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->errors).
  super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tokens).
  super__Vector_base<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>,_std::allocator<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->currentEndIndex = 0;
  (this->tokens).
  super__Vector_base<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>,_std::allocator<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokens).
  super__Vector_base<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>,_std::allocator<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->currentChar = -1;
  this->currentToken = (Token *)0x0;
  (this->lastComment)._M_dataplus._M_p = (pointer)&(this->lastComment).field_2;
  (this->lastComment)._M_string_length = 0;
  (this->lastComment).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&this->fileContent);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&this->lineIndices,0x200);
  return;
}

Assistant:

Lexer::Lexer(const LanguageConfiguration &cfg,
    std::istream &input, const std::string &filePath) noexcept
    : cfg(cfg), input{input}, filePath(filePath),
      fileContent(""), tokens(), lineIndices(), errors(),
      currentStartIndex{0}, currentEndIndex{0},
      currentChar{EOF}, currentToken{nullptr}, lastComment() {
  // 1 KiB should cover most programs
  constexpr size_t FILE_CONTENT_RESERVE = 1024 * 1024;
  fileContent.reserve(FILE_CONTENT_RESERVE); 
  constexpr size_t FILE_CONTENT_LINES = 512;
  lineIndices.reserve(FILE_CONTENT_LINES);
}